

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
          (ScopedFakeTestPartResultReporter *this)

{
  TestPartResultReporterInterface *reporter;
  UnitTestImpl *this_00;
  TestPartResultReporterInterface **ppTVar1;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__ScopedFakeTestPartResultReporter_001c2400;
  this_00 = internal::GetUnitTestImpl();
  reporter = this->old_reporter_;
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    internal::UnitTestImpl::SetGlobalTestPartResultReporter(this_00,reporter);
  }
  else {
    ppTVar1 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                        (&this_00->per_thread_test_part_result_reporter_);
    *ppTVar1 = reporter;
  }
  return;
}

Assistant:

ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    impl->SetGlobalTestPartResultReporter(old_reporter_);
  } else {
    impl->SetTestPartResultReporterForCurrentThread(old_reporter_);
  }
}